

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int get_var(char *data,size_t data_len,char *name,char *dst,size_t dst_len)

{
  int iVar1;
  size_t len_00;
  char *pcVar2;
  char *src;
  int local_54;
  int len;
  size_t name_len;
  char *s;
  char *e;
  char *p;
  size_t dst_len_local;
  char *dst_local;
  char *name_local;
  size_t data_len_local;
  char *data_local;
  
  if ((dst == (char *)0x0) || (dst_len == 0)) {
    local_54 = -2;
  }
  else if (((data == (char *)0x0) || (name == (char *)0x0)) || (data_len == 0)) {
    local_54 = -1;
    *dst = '\0';
  }
  else {
    len_00 = strlen(name);
    pcVar2 = data + data_len;
    local_54 = -1;
    *dst = '\0';
    for (e = data; e + len_00 < pcVar2; e = e + 1) {
      if (((e == data) || (e[-1] == '&')) &&
         ((e[len_00] == '=' && (iVar1 = mg_strncasecmp(name,e,len_00), iVar1 == 0)))) {
        src = e + len_00 + 1;
        name_len = (size_t)memchr(src,0x26,(long)pcVar2 - (long)src);
        if ((void *)name_len == (void *)0x0) {
          name_len = (size_t)pcVar2;
        }
        if (src <= name_len) {
          iVar1 = mg_url_decode(src,(int)name_len - (int)src,dst,(int)dst_len,1);
          if (iVar1 != -1) {
            return iVar1;
          }
          return -2;
        }
        __assert_fail("s >= p",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                      ,0x12f5,"int get_var(const char *, size_t, const char *, char *, size_t)");
      }
    }
  }
  return local_54;
}

Assistant:

static int get_var(const char *data, size_t data_len, const char *name,
                   char *dst, size_t dst_len) {
  const char *p, *e, *s;
  size_t name_len;
  int len;

  if (dst == NULL || dst_len == 0) {
    len = -2;
  } else if (data == NULL || name == NULL || data_len == 0) {
    len = -1;
    dst[0] = '\0';
  } else {
    name_len = strlen(name);
    e = data + data_len;
    len = -1;
    dst[0] = '\0';

    // data is "var1=val1&var2=val2...". Find variable first
    for (p = data; p + name_len < e; p++) {
      if ((p == data || p[-1] == '&') && p[name_len] == '=' &&
          !mg_strncasecmp(name, p, name_len)) {

        // Point p to variable value
        p += name_len + 1;

        // Point s to the end of the value
        s = (const char *) memchr(p, '&', (size_t)(e - p));
        if (s == NULL) {
          s = e;
        }
        assert(s >= p);

        // Decode variable into destination buffer
        len = mg_url_decode(p, (size_t)(s - p), dst, dst_len, 1);

        // Redirect error code from -1 to -2 (destination buffer too small).
        if (len == -1) {
          len = -2;
        }
        break;
      }
    }
  }

  return len;
}